

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O2

void __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::populateDictionary
          (DictionaryCache *this,int32_t startPos,int32_t endPos,int32_t firstRuleStatus,
          int32_t otherRuleStatus)

{
  UText *ut;
  ushort uVar1;
  RuleBasedBreakIterator *pRVar2;
  UTrie2 *pUVar3;
  uint16_t *puVar4;
  int32_t *piVar5;
  uint uVar6;
  int32_t iVar7;
  ushort *puVar8;
  int64_t iVar9;
  LanguageBreakEngine *pLVar10;
  int iVar11;
  ulong uVar12;
  UErrorCode status;
  int local_40;
  UErrorCode local_3c;
  UVector32 *local_38;
  
  if (endPos - startPos < 2) {
    return;
  }
  reset(this);
  this->fFirstRuleStatusIndex = firstRuleStatus;
  this->fOtherRuleStatusIndex = otherRuleStatus;
  local_3c = U_ZERO_ERROR;
  pRVar2 = this->fBI;
  ut = &pRVar2->fText;
  utext_setNativeIndex_63(ut,(long)startPos);
  uVar6 = utext_current32_63(ut);
  pUVar3 = this->fBI->fData->fTrie;
  puVar4 = pUVar3->index;
  if (uVar6 < 0xd800) {
    uVar1 = puVar4[uVar6 >> 5];
  }
  else {
    if (uVar6 < 0x10000) {
      uVar12 = (ulong)((uVar6 >> 5) + 0x140);
      if (0xdbff < uVar6) {
        uVar12 = (ulong)(uVar6 >> 5);
      }
    }
    else {
      if (0x10ffff < uVar6) {
        iVar11 = pUVar3->indexLength + 0x80;
        goto LAB_00294f6c;
      }
      if (pUVar3->highStart <= (int)uVar6) {
        iVar11 = pUVar3->highValueIndex;
        goto LAB_00294f6c;
      }
      uVar12 = (ulong)((uVar6 >> 5 & 0x3f) + (uint)puVar4[(ulong)(uVar6 >> 0xb) + 0x820]);
    }
    uVar1 = puVar4[uVar12];
  }
  iVar11 = (uVar6 & 0x1f) + (uint)uVar1 * 4;
LAB_00294f6c:
  puVar8 = puVar4 + iVar11;
  local_38 = &this->fBreaks;
  local_40 = 0;
  do {
    uVar1 = *puVar8;
    iVar11 = (pRVar2->fText).chunkOffset;
    if ((pRVar2->fText).nativeIndexingLimit < iVar11) {
      iVar9 = (*((pRVar2->fText).pFuncs)->mapOffsetToNative)(ut);
      iVar11 = (int)iVar9;
    }
    else {
      iVar11 = iVar11 + (int)(pRVar2->fText).chunkNativeStart;
    }
    if ((iVar11 < endPos) && ((uVar1 & 0x4000) == 0)) {
      utext_next32_63(ut);
    }
    else {
      if (endPos <= iVar11) {
        if (0 < local_40) {
          uVar6 = (this->fBreaks).count;
          if ((int)uVar6 < 1) {
            iVar11 = 0;
          }
          else {
            iVar11 = *(this->fBreaks).elements;
          }
          if (startPos < iVar11) {
            UVector32::insertElementAt(local_38,startPos,0,&local_3c);
            uVar6 = (this->fBreaks).count;
          }
          if ((int)uVar6 < 1) {
            iVar11 = 0;
          }
          else {
            iVar11 = (this->fBreaks).elements[(ulong)uVar6 - 1];
          }
          if (iVar11 < endPos) {
            UVector32::addElement(local_38,endPos,&local_3c);
            uVar6 = (this->fBreaks).count;
          }
          this->fPositionInCache = 0;
          if ((int)uVar6 < 1) {
            this->fStart = 0;
            iVar7 = 0;
          }
          else {
            piVar5 = (this->fBreaks).elements;
            this->fStart = *piVar5;
            iVar7 = piVar5[(ulong)uVar6 - 1];
          }
          this->fLimit = iVar7;
        }
        return;
      }
      pLVar10 = getLanguageBreakEngine(this->fBI,uVar6);
      if (pLVar10 != (LanguageBreakEngine *)0x0) {
        iVar11 = (*pLVar10->_vptr_LanguageBreakEngine[3])
                           (pLVar10,ut,(ulong)(uint)startPos,(ulong)(uint)endPos,local_38);
        local_40 = local_40 + iVar11;
      }
    }
    uVar6 = utext_current32_63(ut);
    pUVar3 = this->fBI->fData->fTrie;
    puVar4 = pUVar3->index;
    if (uVar6 < 0xd800) {
      uVar1 = puVar4[uVar6 >> 5];
LAB_0029501f:
      iVar11 = (uVar6 & 0x1f) + (uint)uVar1 * 4;
    }
    else {
      if (uVar6 < 0x10000) {
        uVar12 = (ulong)((uVar6 >> 5) + 0x140);
        if (0xdbff < uVar6) {
          uVar12 = (ulong)(uVar6 >> 5);
        }
LAB_0029501b:
        uVar1 = puVar4[uVar12];
        goto LAB_0029501f;
      }
      if (uVar6 < 0x110000) {
        if ((int)uVar6 < pUVar3->highStart) {
          uVar12 = (ulong)((uVar6 >> 5 & 0x3f) + (uint)puVar4[(ulong)(uVar6 >> 0xb) + 0x820]);
          goto LAB_0029501b;
        }
        iVar11 = pUVar3->highValueIndex;
      }
      else {
        iVar11 = pUVar3->indexLength + 0x80;
      }
    }
    puVar8 = puVar4 + iVar11;
  } while( true );
}

Assistant:

void RuleBasedBreakIterator::DictionaryCache::populateDictionary(int32_t startPos, int32_t endPos,
                                       int32_t firstRuleStatus, int32_t otherRuleStatus) {
    if ((endPos - startPos) <= 1) {
        return;
    }

    reset();
    fFirstRuleStatusIndex = firstRuleStatus;
    fOtherRuleStatusIndex = otherRuleStatus;

    int32_t rangeStart = startPos;
    int32_t rangeEnd = endPos;

    uint16_t    category;
    int32_t     current;
    UErrorCode  status = U_ZERO_ERROR;
    int32_t     foundBreakCount = 0;
    UText      *text = &fBI->fText;

    // Loop through the text, looking for ranges of dictionary characters.
    // For each span, find the appropriate break engine, and ask it to find
    // any breaks within the span.

    utext_setNativeIndex(text, rangeStart);
    UChar32     c = utext_current32(text);
    category = UTRIE2_GET16(fBI->fData->fTrie, c);

    while(U_SUCCESS(status)) {
        while((current = (int32_t)UTEXT_GETNATIVEINDEX(text)) < rangeEnd && (category & 0x4000) == 0) {
            utext_next32(text);           // TODO: cleaner loop structure.
            c = utext_current32(text);
            category = UTRIE2_GET16(fBI->fData->fTrie, c);
        }
        if (current >= rangeEnd) {
            break;
        }

        // We now have a dictionary character. Get the appropriate language object
        // to deal with it.
        const LanguageBreakEngine *lbe = fBI->getLanguageBreakEngine(c);

        // Ask the language object if there are any breaks. It will add them to the cache and
        // leave the text pointer on the other side of its range, ready to search for the next one.
        if (lbe != NULL) {
            foundBreakCount += lbe->findBreaks(text, rangeStart, rangeEnd, fBreaks);
        }

        // Reload the loop variables for the next go-round
        c = utext_current32(text);
        category = UTRIE2_GET16(fBI->fData->fTrie, c);
    }

    // If we found breaks, ensure that the first and last entries are
    // the original starting and ending position. And initialize the
    // cache iteration position to the first entry.

    // printf("foundBreakCount = %d\n", foundBreakCount);
    if (foundBreakCount > 0) {
        U_ASSERT(foundBreakCount == fBreaks.size());
        if (startPos < fBreaks.elementAti(0)) {
            // The dictionary did not place a boundary at the start of the segment of text.
            // Add one now. This should not commonly happen, but it would be easy for interactions
            // of the rules for dictionary segments and the break engine implementations to
            // inadvertently cause it. Cover it here, just in case.
            fBreaks.insertElementAt(startPos, 0, status);
        }
        if (endPos > fBreaks.peeki()) {
            fBreaks.push(endPos, status);
        }
        fPositionInCache = 0;
        // Note: Dictionary matching may extend beyond the original limit.
        fStart = fBreaks.elementAti(0);
        fLimit = fBreaks.peeki();
    } else {
        // there were no language-based breaks, even though the segment contained
        // dictionary characters. Subsequent attempts to fetch boundaries from the dictionary cache
        // for this range will fail, and the calling code will fall back to the rule based boundaries.
    }
}